

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Int64 __thiscall Json::Value::asInt64(Value *this)

{
  bool bVar1;
  ulong uVar2;
  undefined8 extraout_RAX;
  longlong val;
  ostringstream oss;
  string local_1a8;
  string local_188 [3];
  ios_base local_118 [264];
  
  uVar2 = (ulong)(byte)this->field_0x8;
  switch(uVar2) {
  case 0:
    break;
  case 1:
  case 3:
switchD_0011b329_caseD_1:
    uVar2 = (this->value_).int_;
    break;
  case 2:
    bVar1 = isInt64(this);
    if (bVar1) goto switchD_0011b329_caseD_1;
    goto LAB_0011b3e2;
  case 4:
    if (ABS((this->value_).real_) <= 9.223372036854776e+18) {
      return (long)(this->value_).real_;
    }
    goto LAB_0011b418;
  case 5:
    asString_abi_cxx11_(local_188,this);
    bVar1 = converToInt64(local_188[0]._M_dataplus._M_p,(longlong *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188[0]._M_dataplus._M_p != &local_188[0].field_2) {
      operator_delete(local_188[0]._M_dataplus._M_p);
    }
    if (bVar1) {
      return (Int64)local_1a8._M_dataplus._M_p;
    }
  default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"Value is not convertible to Int64.",0x22);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a8);
LAB_0011b3e2:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"LargestUInt out of Int64 range",0x1e);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a8);
LAB_0011b418:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_188,"double out of Int64 range",0x19);
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
    std::ios_base::~ios_base(local_118);
    _Unwind_Resume(extraout_RAX);
  case 6:
    uVar2 = (ulong)(this->value_).bool_;
  }
  return uVar2;
}

Assistant:

Value::Int64 Value::asInt64() const {
  switch (type_) {
  case int64Value:
  case intValue:
    return Int64(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt64(), "LargestUInt out of Int64 range");
    return Int64(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt64, maxInt64),
                        "double out of Int64 range");
    return Int64(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  case stringValue: {
    long long int val;

    if (!converToInt64 (asString().c_str(), &val)) {
      break;
    }

    JSON_ASSERT_MESSAGE(IsInRange (val, minInt64, maxInt64),
                        "LargestUInt out of Int64 range");
    return Int64(val);
  }
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int64.");
}